

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O0

void tool_help(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; helptext[local_c] != (char *)0x0; local_c = local_c + 1) {
    puts(helptext[local_c]);
  }
  return;
}

Assistant:

void tool_help(void)
{
  int i;
  for(i = 0; helptext[i]; i++) {
    puts(helptext[i]);
#ifdef PRINT_LINES_PAUSE
    if(i && ((i % PRINT_LINES_PAUSE) == 0))
      tool_pressanykey();
#endif
  }
}